

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsServer.h
# Opt level: O2

void __thiscall Scs::Server::ClientConnection::ClientConnection(ClientConnection *this,Server *svr)

{
  this->server = svr;
  (this->socket).super___shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->thread)._M_id._M_thread = 0;
  (this->socket).super___shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  this->clientID = -1;
  this->connected = false;
  SendQueue::SendQueue(&this->sendQueue);
  ReceiveQueue::ReceiveQueue(&this->receiveQueue);
  return;
}

Assistant:

ClientConnection(const Server & svr) :
				server(svr),
				clientID(-1),
				connected(false)
				{}